

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

int lua_getstack(lua_State *L,int level,lua_Debug *ar)

{
  bool bVar1;
  CallInfo *local_30;
  CallInfo *ci;
  int status;
  lua_Debug *ar_local;
  int level_local;
  lua_State *L_local;
  
  local_30 = L->ci;
  ar_local._4_4_ = level;
  while( true ) {
    bVar1 = false;
    if (0 < ar_local._4_4_) {
      bVar1 = L->base_ci < local_30;
    }
    if (!bVar1) break;
    ar_local._4_4_ = ar_local._4_4_ + -1;
    if ((((local_30->func->value).gc)->h).flags == '\0') {
      ar_local._4_4_ = ar_local._4_4_ - local_30->tailcalls;
    }
    local_30 = local_30 + -1;
  }
  if ((ar_local._4_4_ == 0) && (L->base_ci < local_30)) {
    ci._4_4_ = 1;
    ar->i_ci = (int)(((long)local_30 - (long)L->base_ci) / 0x28);
  }
  else {
    if (ar_local._4_4_ < 0) {
      ar->i_ci = 0;
    }
    ci._4_4_ = (uint)(ar_local._4_4_ < 0);
  }
  return ci._4_4_;
}

Assistant:

LUA_API int lua_getstack (lua_State *L, int level, lua_Debug *ar) {
  int status;
  CallInfo *ci;
  lua_lock(L);
  for (ci = L->ci; level > 0 && ci > L->base_ci; ci--) {
    level--;
    if (f_isLua(ci))  /* Lua function? */
      level -= ci->tailcalls;  /* skip lost tail calls */
  }
  if (level == 0 && ci > L->base_ci) {  /* level found? */
    status = 1;
    ar->i_ci = cast_int(ci - L->base_ci);
  }
  else if (level < 0) {  /* level is of a lost tail call? */
    status = 1;
    ar->i_ci = 0;
  }
  else status = 0;  /* no such level */
  lua_unlock(L);
  return status;
}